

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O2

PSBTAnalysis *
node::AnalyzePSBT(PSBTAnalysis *__return_storage_ptr__,PartiallySignedTransaction psbtx)

{
  PSBTRole PVar1;
  long lVar2;
  pointer pPVar3;
  string err_msg;
  string err_msg_00;
  string err_msg_01;
  string err_msg_02;
  PartiallySignedTransaction psbt;
  SigningProvider *provider;
  bool bVar4;
  ulong uVar5;
  undefined8 extraout_RAX;
  pointer pCVar6;
  int64_t nSigOpCost;
  unsigned_long uVar7;
  PSBTRole PVar8;
  ulong uVar9;
  pointer pPVar10;
  long lVar11;
  uint uVar12;
  PartiallySignedTransaction *in_RSI;
  string *this;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff87c;
  PSBTAnalysis *pPVar14;
  vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_> *this_00;
  undefined4 in_stack_fffffffffffff890;
  uint uVar15;
  char local_768;
  undefined7 uStack_767;
  ulong local_758;
  CFeeRate feerate;
  CCoinsView view_dummy;
  CMutableTransaction mtx;
  CAmount fee;
  CTxOut utxo;
  undefined4 local_6d0;
  undefined1 auStack_6cc [76];
  string local_678 [32];
  SignatureData outdata;
  PartiallySignedTransaction local_2c8;
  string local_1c0;
  string local_1a0;
  string local_180;
  PrecomputedTransactionData txdata;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>.
  _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = false;
  (__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
  super__Optional_payload_base<CFeeRate>._M_engaged = false;
  (__return_storage_ptr__->fee).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  this_00 = &__return_storage_ptr__->inputs;
  (__return_storage_ptr__->inputs).
  super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->inputs).
  super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->inputs).
  super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->error)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).field_2;
  (__return_storage_ptr__->error)._M_string_length = 0;
  (__return_storage_ptr__->error).field_2._M_local_buf[0] = '\0';
  std::vector<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>::resize
            (this_00,((long)*(pointer *)
                             ((long)&(in_RSI->tx).
                                     super__Optional_base<CMutableTransaction,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                     .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                     _M_value.vin + 8) -
                     *(long *)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                               _M_payload.
                               super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value
                               .vin) / 0x68);
  PrecomputePSBTData(&txdata,in_RSI);
  provider = DUMMY_SIGNING_PROVIDER;
  uVar15 = (uint)CONCAT71((int7)((ulong)DUMMY_SIGNING_PROVIDER >> 8),1);
  mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start
  ._0_4_ = 0;
  local_758 = 0;
  local_768 = '\0';
  uStack_767 = 0;
  while( true ) {
    uVar9 = (ulong)(uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                         super__Vector_impl_data._M_start;
    uVar5 = ((long)*(pointer *)
                    ((long)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                            _M_payload.
                            super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                            super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                            vin + 8) -
            *(long *)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                      _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin) /
            0x68;
    if (uVar5 <= uVar9) break;
    pPVar3 = (in_RSI->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
             super__Vector_impl_data._M_start;
    pPVar10 = (this_00->
              super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>)
              ._M_impl.super__Vector_impl_data._M_start;
    pPVar10[uVar9].next = EXTRACTOR;
    CTxOut::CTxOut(&utxo);
    bVar4 = PartiallySignedTransaction::GetInputUTXO
                      (in_RSI,&utxo,
                       (uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                             super__Vector_impl_data._M_start);
    pPVar10 = pPVar10 + uVar9;
    if (bVar4) {
      if ((2100000000000000 < (ulong)utxo.nValue) || (2100000000000000 < utxo.nValue + local_758)) {
        tinyformat::format<unsigned_int>
                  (&local_180,"PSBT is not valid. Input %u has invalid value",(uint *)&mtx);
        err_msg_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff87c;
        err_msg_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff878;
        err_msg_00._M_string_length = (size_type)__return_storage_ptr__;
        err_msg_00.field_2._M_allocated_capacity._0_4_ = (int)this_00;
        err_msg_00.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this_00 >> 0x20);
        err_msg_00.field_2._8_4_ = in_stack_fffffffffffff890;
        err_msg_00.field_2._12_4_ = uVar15;
        PSBTAnalysis::SetInvalid(__return_storage_ptr__,err_msg_00);
        this = &local_180;
        goto LAB_008e3c74;
      }
      pPVar10->has_utxo = true;
      local_758 = utxo.nValue + local_758;
LAB_008e383c:
      if ((utxo.nValue != -1) && (bVar4 = CScript::IsUnspendable(&utxo.scriptPubKey), bVar4)) {
        tinyformat::format<unsigned_int>
                  (&local_1c0,"PSBT is not valid. Input %u spends unspendable output",(uint *)&mtx);
        err_msg._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff87c;
        err_msg._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff878;
        err_msg._M_string_length = (size_type)__return_storage_ptr__;
        err_msg.field_2._M_allocated_capacity._0_4_ = (int)this_00;
        err_msg.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this_00 >> 0x20);
        err_msg.field_2._8_4_ = in_stack_fffffffffffff890;
        err_msg.field_2._12_4_ = uVar15;
        PSBTAnalysis::SetInvalid(__return_storage_ptr__,err_msg);
        this = &local_1c0;
        goto LAB_008e3c74;
      }
      PartiallySignedTransaction::PartiallySignedTransaction(&local_2c8,in_RSI);
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._4_4_ = in_stack_fffffffffffff87c
      ;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._0_4_ = in_stack_fffffffffffff878
      ;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
      super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)__return_storage_ptr__;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._16_4_ = (int)this_00;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._20_4_ =
           (int)((ulong)this_00 >> 0x20);
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._24_4_ =
           in_stack_fffffffffffff890;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._28_4_ = uVar15;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._32_1_ = local_768;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._33_7_ = uStack_767;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
      super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)in_RSI;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._M_payload._48_8_ = local_758;
      psbt.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
      super__Optional_payload<CMutableTransaction,_true,_false,_false>.
      super__Optional_payload_base<CMutableTransaction>._56_8_ = provider;
      psbt.m_xpubs._M_t._M_impl._0_8_ = feerate.nSatoshisPerK;
      psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = view_dummy._vptr_CCoinsView;
      psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
           (uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
      psbt.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ =
           mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
           ._M_start._4_4_;
      psbt._88_48_ = mtx._8_48_;
      psbt.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)fee;
      psbt.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)utxo.nValue;
      psbt._152_32_ = utxo.scriptPubKey.super_CScriptBase;
      psbt.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = local_6d0;
      psbt._188_76_ = auStack_6cc;
      bVar4 = PSBTInputSignedAndVerified
                        (psbt,(uint)&local_2c8,
                         (PrecomputedTransactionData *)
                         (ulong)(uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
      PartiallySignedTransaction::~PartiallySignedTransaction(&local_2c8);
      if (bVar4) {
        bVar4 = true;
        if (utxo.nValue != -1) {
          pPVar10->is_final = true;
        }
      }
      else {
        pPVar10->is_final = false;
        outdata.complete = false;
        outdata.witness = false;
        outdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        memset(&outdata.scriptSig,0,0xb8);
        outdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
        super__Optional_payload<TaprootBuilder,_true,_false,_false>.
        super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
        outdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        outdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        outdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.taproot_key_path_sig.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        outdata.taproot_key_path_sig.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        outdata.taproot_key_path_sig.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        outdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        outdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        outdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        outdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        outdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        outdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        outdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
        outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
        outdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        outdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        outdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        outdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &outdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
        outdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        in_stack_fffffffffffff878 = 1;
        outdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        outdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             outdata.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar4 = SignPSBTInput(provider,in_RSI,
                              (uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                    _M_impl.super__Vector_impl_data._M_start,&txdata,1,&outdata,true
                             );
        PVar8 = FINALIZER;
        if (!bVar4) {
          std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                    (&pPVar10->missing_pubkeys,&outdata.missing_pubkeys);
          *(undefined4 *)
           ((long)&(pPVar10->missing_redeem_script).super_base_blob<160U>.m_data + 0x10) =
               outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems._16_4_;
          *(undefined8 *)(pPVar10->missing_redeem_script).super_base_blob<160U>.m_data._M_elems =
               outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems._0_8_;
          *(undefined8 *)((long)&(pPVar10->missing_redeem_script).super_base_blob<160U>.m_data + 8)
               = outdata.missing_redeem_script.super_base_blob<160U>.m_data._M_elems._8_8_;
          *(ulong *)(pPVar10->missing_witness_script).super_base_blob<256U>.m_data._M_elems =
               CONCAT44(outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems._4_4_,
                        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems._0_4_);
          *(ulong *)((long)&(pPVar10->missing_witness_script).super_base_blob<256U>.m_data + 8) =
               CONCAT44(outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems._12_4_,
                        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems._8_4_);
          *(ulong *)((long)&(pPVar10->missing_witness_script).super_base_blob<256U>.m_data + 0x10) =
               CONCAT44(outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems._20_4_,
                        outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems._16_4_)
          ;
          *(undefined8 *)
           ((long)&(pPVar10->missing_witness_script).super_base_blob<256U>.m_data + 0x18) =
               outdata.missing_witness_script.super_base_blob<256U>.m_data._M_elems._24_8_;
          std::vector<CKeyID,_std::allocator<CKeyID>_>::operator=
                    (&pPVar10->missing_sigs,&outdata.missing_sigs);
          if ((((outdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl
                 .super__Vector_impl_data._M_start !=
                 outdata.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl
                 .super__Vector_impl_data._M_finish) ||
               (bVar4 = base_blob<160U>::IsNull
                                  (&outdata.missing_redeem_script.super_base_blob<160U>), !bVar4))
              || (bVar4 = base_blob<256U>::IsNull
                                    (&outdata.missing_witness_script.super_base_blob<256U>), !bVar4)
              ) || (PVar8 = SIGNER,
                   outdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   outdata.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
                   super__Vector_impl_data._M_finish)) {
            PVar8 = UPDATER;
          }
        }
        pPVar10->next = PVar8;
        SignatureData::~SignatureData(&outdata);
        bVar4 = true;
      }
    }
    else {
      lVar11 = (long)pPVar3[uVar9].non_witness_utxo.
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((lVar11 == 0) ||
         ((ulong)*(uint *)(*(long *)&(in_RSI->tx).
                                     super__Optional_base<CMutableTransaction,_false,_false>.
                                     _M_payload.
                                     super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                     .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                     _M_value.vin + 0x20 +
                          (ulong)(uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                       _M_impl.super__Vector_impl_data._M_start * 0x68) <
          (ulong)((*(long *)(lVar11 + 0x20) - *(long *)(lVar11 + 0x18)) / 0x28))) {
        pPVar10->has_utxo = false;
        pPVar10->is_final = false;
        pPVar10->next = UPDATER;
        uVar15 = 0;
        goto LAB_008e383c;
      }
      tinyformat::format<unsigned_int>
                (&local_1a0,"PSBT is not valid. Input %u specifies invalid prevout",(uint *)&mtx);
      this = &local_1a0;
      err_msg_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff87c;
      err_msg_01._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff878;
      err_msg_01._M_string_length = (size_type)__return_storage_ptr__;
      err_msg_01.field_2._M_allocated_capacity._0_4_ = (int)this_00;
      err_msg_01.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this_00 >> 0x20);
      err_msg_01.field_2._8_4_ = in_stack_fffffffffffff890;
      err_msg_01.field_2._12_4_ = uVar15;
      PSBTAnalysis::SetInvalid(__return_storage_ptr__,err_msg_01);
LAB_008e3c74:
      std::__cxx11::string::~string((string *)this);
      uStack_767 = (undefined7)((ulong)extraout_RAX >> 8);
      local_768 = '\x01';
      bVar4 = false;
    }
    prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
              (&utxo.scriptPubKey.super_CScriptBase);
    if (!bVar4) {
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
      if (local_768 == '\0') {
        PSBTAnalysis::~PSBTAnalysis(__return_storage_ptr__);
      }
      goto LAB_008e3fa7;
    }
    mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ =
         (uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
  }
  __return_storage_ptr__->next = EXTRACTOR;
  pPVar10 = (__return_storage_ptr__->inputs).
            super__Vector_base<node::PSBTInputAnalysis,_std::allocator<node::PSBTInputAnalysis>_>.
            _M_impl.super__Vector_impl_data._M_start;
  PVar8 = EXTRACTOR;
  for (uVar12 = 0; uVar12 < uVar5; uVar12 = uVar12 + 1) {
    PVar1 = pPVar10[uVar12].next;
    if ((int)PVar1 < (int)PVar8) {
      PVar8 = PVar1;
    }
    __return_storage_ptr__->next = PVar8;
  }
  if ((int)PVar8 < 1) {
    __assert_fail("result.next > PSBTRole::CREATOR",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/psbt.cpp"
                  ,0x60,"PSBTAnalysis node::AnalyzePSBT(PartiallySignedTransaction)");
  }
  if ((uVar15 & 1) != 0) {
    uVar9 = 0;
    uVar5 = 0xffffffffffffffff;
    for (pCVar6 = *(pointer *)
                   &(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                    super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                    super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
                    super__Vector_base<CTxOut,_std::allocator<CTxOut>_>;
        pCVar6 != *(pointer *)
                   ((long)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                           _M_payload.
                           super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                           super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                           vout + 8); pCVar6 = pCVar6 + 1) {
      uVar13 = uVar5;
      if (((uVar9 < 0x775f05a074001) && ((ulong)pCVar6->nValue < 0x775f05a074001)) &&
         (uVar13 = pCVar6->nValue + uVar9, 2100000000000000 < uVar13)) {
        uVar13 = uVar5;
      }
      uVar9 = uVar13;
    }
    if (uVar9 < 0x775f05a074001) {
      fee = local_758 - uVar9;
      (__return_storage_ptr__->fee).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_payload._M_value = fee;
      (__return_storage_ptr__->fee).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
      CMutableTransaction::CMutableTransaction(&mtx,(CMutableTransaction *)in_RSI);
      view_dummy._vptr_CCoinsView = (_func_int **)&PTR_GetCoin_01149610;
      uVar12 = 0;
      CCoinsViewCache::CCoinsViewCache((CCoinsViewCache *)&outdata,&view_dummy,false);
      uVar15 = 1;
      do {
        uVar5 = (ulong)uVar12;
        if ((ulong)(((long)*(pointer *)
                            ((long)&(in_RSI->tx).
                                    super__Optional_base<CMutableTransaction,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                    .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                    _M_value.vin + 8) -
                    *(long *)&(in_RSI->tx).super__Optional_base<CMutableTransaction,_false,_false>.
                              _M_payload.
                              super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                              super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                              vin) / 0x68) <= uVar5) break;
        pPVar3 = (in_RSI->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Coin::Coin((Coin *)&utxo);
        bVar4 = SignPSBTInput(provider,in_RSI,uVar12,(PrecomputedTransactionData *)0x0,1,
                              (SignatureData *)0x0,true);
        if ((bVar4) &&
           (bVar4 = PartiallySignedTransaction::GetInputUTXO(in_RSI,&utxo,uVar12), bVar4)) {
          lVar11 = uVar5 * 0x68;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     (CONCAT44(mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                               super__Vector_impl_data._M_start._4_4_,
                               (uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                     _M_impl.super__Vector_impl_data._M_start) + lVar11 + 0x28),
                     &pPVar3[uVar5].final_script_sig.super_CScriptBase);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::operator=((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       *)(CONCAT44(mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl
                                   .super__Vector_impl_data._M_start._4_4_,
                                   (uint)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                         _M_impl.super__Vector_impl_data._M_start) + lVar11 + 0x50),
                      &pPVar3[uVar5].final_script_witness.stack);
          bVar4 = true;
          CCoinsViewCache::AddCoin
                    ((CCoinsViewCache *)&outdata,
                     (COutPoint *)
                     (lVar11 + *(long *)&(in_RSI->tx).
                                         super__Optional_base<CMutableTransaction,_false,_false>.
                                         _M_payload.
                                         super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                         .super__Optional_payload_base<CMutableTransaction>.
                                         _M_payload._M_value.vin),(Coin *)&utxo,true);
        }
        else {
          bVar4 = false;
          uVar15 = 0;
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  (&utxo.scriptPubKey.super_CScriptBase);
        uVar12 = uVar12 + 1;
      } while (bVar4);
      if ((uVar15 & 1) != 0) {
        CTransaction::CTransaction((CTransaction *)&utxo,&mtx);
        nSigOpCost = GetTransactionSigOpCost
                               ((CTransaction *)&utxo,(CCoinsViewCache *)&outdata,0x1fffdf);
        uVar7 = GetVirtualTransactionSize((CTransaction *)&utxo,nSigOpCost,nBytesPerSigOp);
        (__return_storage_ptr__->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_long>._M_payload._M_value = uVar7;
        (__return_storage_ptr__->estimated_vsize).super__Optional_base<unsigned_long,_true,_true>.
        _M_payload.super__Optional_payload_base<unsigned_long>._M_engaged = true;
        CFeeRate::CFeeRate(&feerate,&fee,(uint32_t)uVar7);
        if ((__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>.
            _M_payload.super__Optional_payload_base<CFeeRate>._M_engaged == false) {
          (__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>.
          _M_payload.super__Optional_payload_base<CFeeRate>._M_engaged = true;
        }
        (__return_storage_ptr__->estimated_feerate).super__Optional_base<CFeeRate,_true,_true>.
        _M_payload.super__Optional_payload_base<CFeeRate>._M_payload._M_value.nSatoshisPerK =
             feerate.nSatoshisPerK;
        CTransaction::~CTransaction((CTransaction *)&utxo);
      }
      CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)&outdata);
      CMutableTransaction::~CMutableTransaction(&mtx);
    }
    else {
      pPVar14 = __return_storage_ptr__;
      std::__cxx11::string::string<std::allocator<char>>
                (local_678,"PSBT is not valid. Output amount invalid",(allocator<char> *)&outdata);
      err_msg_02._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff87c;
      err_msg_02._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff878;
      err_msg_02._M_string_length = (size_type)pPVar14;
      err_msg_02.field_2._M_allocated_capacity._0_4_ = (int)this_00;
      err_msg_02.field_2._M_allocated_capacity._4_4_ = (int)((ulong)this_00 >> 0x20);
      err_msg_02.field_2._8_4_ = in_stack_fffffffffffff890;
      err_msg_02.field_2._12_4_ = uVar15;
      PSBTAnalysis::SetInvalid(__return_storage_ptr__,err_msg_02);
      std::__cxx11::string::~string(local_678);
    }
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txdata.m_spent_outputs);
LAB_008e3fa7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PSBTAnalysis AnalyzePSBT(PartiallySignedTransaction psbtx)
{
    // Go through each input and build status
    PSBTAnalysis result;

    bool calc_fee = true;

    CAmount in_amt = 0;

    result.inputs.resize(psbtx.tx->vin.size());

    const PrecomputedTransactionData txdata = PrecomputePSBTData(psbtx);

    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInput& input = psbtx.inputs[i];
        PSBTInputAnalysis& input_analysis = result.inputs[i];

        // We set next role here and ratchet backwards as required
        input_analysis.next = PSBTRole::EXTRACTOR;

        // Check for a UTXO
        CTxOut utxo;
        if (psbtx.GetInputUTXO(utxo, i)) {
            if (!MoneyRange(utxo.nValue) || !MoneyRange(in_amt + utxo.nValue)) {
                result.SetInvalid(strprintf("PSBT is not valid. Input %u has invalid value", i));
                return result;
            }
            in_amt += utxo.nValue;
            input_analysis.has_utxo = true;
        } else {
            if (input.non_witness_utxo && psbtx.tx->vin[i].prevout.n >= input.non_witness_utxo->vout.size()) {
                result.SetInvalid(strprintf("PSBT is not valid. Input %u specifies invalid prevout", i));
                return result;
            }
            input_analysis.has_utxo = false;
            input_analysis.is_final = false;
            input_analysis.next = PSBTRole::UPDATER;
            calc_fee = false;
        }

        if (!utxo.IsNull() && utxo.scriptPubKey.IsUnspendable()) {
            result.SetInvalid(strprintf("PSBT is not valid. Input %u spends unspendable output", i));
            return result;
        }

        // Check if it is final
        if (!PSBTInputSignedAndVerified(psbtx, i, &txdata)) {
            input_analysis.is_final = false;

            // Figure out what is missing
            SignatureData outdata;
            bool complete = SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, &txdata, 1, &outdata);

            // Things are missing
            if (!complete) {
                input_analysis.missing_pubkeys = outdata.missing_pubkeys;
                input_analysis.missing_redeem_script = outdata.missing_redeem_script;
                input_analysis.missing_witness_script = outdata.missing_witness_script;
                input_analysis.missing_sigs = outdata.missing_sigs;

                // If we are only missing signatures and nothing else, then next is signer
                if (outdata.missing_pubkeys.empty() && outdata.missing_redeem_script.IsNull() && outdata.missing_witness_script.IsNull() && !outdata.missing_sigs.empty()) {
                    input_analysis.next = PSBTRole::SIGNER;
                } else {
                    input_analysis.next = PSBTRole::UPDATER;
                }
            } else {
                input_analysis.next = PSBTRole::FINALIZER;
            }
        } else if (!utxo.IsNull()){
            input_analysis.is_final = true;
        }
    }

    // Calculate next role for PSBT by grabbing "minimum" PSBTInput next role
    result.next = PSBTRole::EXTRACTOR;
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInputAnalysis& input_analysis = result.inputs[i];
        result.next = std::min(result.next, input_analysis.next);
    }
    assert(result.next > PSBTRole::CREATOR);

    if (calc_fee) {
        // Get the output amount
        CAmount out_amt = std::accumulate(psbtx.tx->vout.begin(), psbtx.tx->vout.end(), CAmount(0),
            [](CAmount a, const CTxOut& b) {
                if (!MoneyRange(a) || !MoneyRange(b.nValue) || !MoneyRange(a + b.nValue)) {
                    return CAmount(-1);
                }
                return a += b.nValue;
            }
        );
        if (!MoneyRange(out_amt)) {
            result.SetInvalid("PSBT is not valid. Output amount invalid");
            return result;
        }

        // Get the fee
        CAmount fee = in_amt - out_amt;
        result.fee = fee;

        // Estimate the size
        CMutableTransaction mtx(*psbtx.tx);
        CCoinsView view_dummy;
        CCoinsViewCache view(&view_dummy);
        bool success = true;

        for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
            PSBTInput& input = psbtx.inputs[i];
            Coin newcoin;

            if (!SignPSBTInput(DUMMY_SIGNING_PROVIDER, psbtx, i, nullptr, 1) || !psbtx.GetInputUTXO(newcoin.out, i)) {
                success = false;
                break;
            } else {
                mtx.vin[i].scriptSig = input.final_script_sig;
                mtx.vin[i].scriptWitness = input.final_script_witness;
                newcoin.nHeight = 1;
                view.AddCoin(psbtx.tx->vin[i].prevout, std::move(newcoin), true);
            }
        }

        if (success) {
            CTransaction ctx = CTransaction(mtx);
            size_t size(GetVirtualTransactionSize(ctx, GetTransactionSigOpCost(ctx, view, STANDARD_SCRIPT_VERIFY_FLAGS), ::nBytesPerSigOp));
            result.estimated_vsize = size;
            // Estimate fee rate
            CFeeRate feerate(fee, size);
            result.estimated_feerate = feerate;
        }

    }

    return result;
}